

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

int Abc_NtkIsDfsOrdered(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  undefined4 uVar2;
  long *plVar3;
  long lVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  Vec_Ptr_t *extraout_RDX_02;
  Vec_Ptr_t *extraout_RDX_03;
  char *__assertion;
  long lVar8;
  long *plVar9;
  int iVar10;
  long lVar11;
  
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar7 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar7 + 500;
    iVar10 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar10) {
      piVar5 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar5;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar10;
      in_RDX = extraout_RDX;
    }
    if (-500 < iVar7) {
      memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
      in_RDX = extraout_RDX_00;
    }
    (pNtk->vTravIds).nSize = iVar10;
  }
  iVar7 = pNtk->nTravIds;
  pNtk->nTravIds = iVar7 + 1;
  if (0x3ffffffe < iVar7) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar6 = pNtk->vCis;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    do {
      lVar8 = *pVVar6->pArray[lVar11];
      uVar2 = *(undefined4 *)(lVar8 + 0xd8);
      iVar7 = (int)*(long *)((long)pVVar6->pArray[lVar11] + 0x10);
      Vec_IntFillExtra((Vec_Int_t *)(lVar8 + 0xe0),iVar7 + 1,(int)in_RDX);
      if (((long)iVar7 < 0) || (*(int *)(lVar8 + 0xe4) <= iVar7)) goto LAB_0084cd86;
      *(undefined4 *)(*(long *)(lVar8 + 0xe8) + (long)iVar7 * 4) = uVar2;
      lVar11 = lVar11 + 1;
      pVVar6 = pNtk->vCis;
      in_RDX = extraout_RDX_01;
    } while (lVar11 < pVVar6->nSize);
  }
  pVVar6 = pNtk->vObjs;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    do {
      plVar3 = (long *)pVVar6->pArray[lVar11];
      if ((plVar3 != (long *)0x0) && ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7)) {
        if (0 < *(int *)((long)plVar3 + 0x1c)) {
          lVar8 = 0;
          do {
            plVar9 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                               (long)*(int *)(plVar3[4] + lVar8 * 4) * 8);
            lVar4 = *plVar9;
            iVar7 = (int)plVar9[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar4 + 0xe0),iVar7 + 1,(int)pVVar6);
            if (((long)iVar7 < 0) || (*(int *)(lVar4 + 0xe4) <= iVar7)) goto LAB_0084cda5;
            if (*(int *)(*(long *)(lVar4 + 0xe8) + (long)iVar7 * 4) != *(int *)(*plVar9 + 0xd8)) {
              return 0;
            }
            lVar8 = lVar8 + 1;
            pVVar6 = extraout_RDX_02;
          } while (lVar8 < *(int *)((long)plVar3 + 0x1c));
        }
        iVar7 = (int)pVVar6;
        if (pNtk->ntkType == ABC_NTK_STRASH) {
          if (((ulong)plVar3 & 1) != 0) {
            __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_0084cdf3:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                          ,400,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
          }
          if (*(int *)*plVar3 != 3) {
            __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
            goto LAB_0084cdf3;
          }
          if ((plVar3[7] != 0) && (plVar9 = plVar3, 0 < *(int *)((long)plVar3 + 0x2c))) {
            while( true ) {
              iVar7 = (int)pVVar6;
              plVar9 = (long *)plVar9[7];
              if (plVar9 == (long *)0x0) break;
              lVar8 = *plVar9;
              iVar10 = (int)plVar9[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar8 + 0xe0),iVar10 + 1,iVar7);
              if (((long)iVar10 < 0) || (*(int *)(lVar8 + 0xe4) <= iVar10)) {
LAB_0084cda5:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              pVVar6 = extraout_RDX_03;
              if (*(int *)(*(long *)(lVar8 + 0xe8) + (long)iVar10 * 4) != *(int *)(*plVar9 + 0xd8))
              {
                return 0;
              }
            }
          }
        }
        lVar8 = *plVar3;
        uVar2 = *(undefined4 *)(lVar8 + 0xd8);
        iVar10 = (int)plVar3[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar8 + 0xe0),iVar10 + 1,iVar7);
        if (((long)iVar10 < 0) || (*(int *)(lVar8 + 0xe4) <= iVar10)) {
LAB_0084cd86:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(undefined4 *)(*(long *)(lVar8 + 0xe8) + (long)iVar10 * 4) = uVar2;
      }
      lVar11 = lVar11 + 1;
      pVVar6 = pNtk->vObjs;
    } while (lVar11 < pVVar6->nSize);
  }
  return 1;
}

Assistant:

int Abc_NtkIsDfsOrdered( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode, * pFanin;
    int i, k;
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // mark the CIs
    Abc_NtkForEachCi( pNtk, pNode, i )
        Abc_NodeSetTravIdCurrent( pNode );
    // go through the nodes
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        // check the fanins of the node
        Abc_ObjForEachFanin( pNode, pFanin, k )
            if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                return 0;
        // check the choices of the node
        if ( Abc_NtkIsStrash(pNtk) && Abc_AigNodeIsChoice(pNode) )
            for ( pFanin = (Abc_Obj_t *)pNode->pData; pFanin; pFanin = (Abc_Obj_t *)pFanin->pData )
                if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                    return 0;
        // mark the node as visited
        Abc_NodeSetTravIdCurrent( pNode );
    }
    return 1;
}